

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::TextureVkImpl::~TextureVkImpl(TextureVkImpl *this)

{
  if ((this->m_VulkanImage).m_VkObject != (VkImage_T *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkImage_T*,(VulkanUtilities::VulkanHandleTypeId)4>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_pDevice,&this->m_VulkanImage,
               (this->super_TextureBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               .m_Desc.ImmediateContextMask);
  }
  if ((this->m_StagingBuffer).m_VkObject != (VkBuffer_T *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_pDevice,&this->m_StagingBuffer,
               (this->super_TextureBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
               .m_Desc.ImmediateContextMask);
  }
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_pDevice,&this->m_MemoryAllocation,
             (this->super_TextureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             .m_Desc.ImmediateContextMask);
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(&this->m_MemoryAllocation);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper(&this->m_StagingBuffer);
  VulkanUtilities::VulkanObjectWrapper<VkImage_T_*,_(VulkanUtilities::VulkanHandleTypeId)4>::
  ~VulkanObjectWrapper(&this->m_VulkanImage);
  TextureBase<Diligent::EngineVkImplTraits>::~TextureBase
            (&this->super_TextureBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

TextureVkImpl::~TextureVkImpl()
{
    // Vk object can only be destroyed when it is no longer used by the GPU
    // Wrappers for external texture will not be destroyed as they are created with null device pointer
    if (m_VulkanImage)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanImage), m_Desc.ImmediateContextMask);
    if (m_StagingBuffer)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_StagingBuffer), m_Desc.ImmediateContextMask);
    m_pDevice->SafeReleaseDeviceObject(std::move(m_MemoryAllocation), m_Desc.ImmediateContextMask);
}